

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

string * __thiscall Matrix::ToLaTex_abi_cxx11_(string *__return_storage_ptr__,Matrix *this)

{
  ostream *this_00;
  const_reference this_01;
  const_reference this_02;
  string local_1c8;
  int local_1a4;
  int local_1a0;
  int j;
  int i;
  ostringstream local_190 [8];
  ostringstream out;
  Matrix *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  this_00 = std::operator<<((ostream *)local_190,"\\begin{bmatrix}");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  for (local_1a0 = 0; local_1a0 < this->n_; local_1a0 = local_1a0 + 1) {
    for (local_1a4 = 0; local_1a4 < this->m_; local_1a4 = local_1a4 + 1) {
      this_01 = std::
                vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                ::operator[](&this->elements_,(long)local_1a0);
      this_02 = std::vector<Fraction,_std::allocator<Fraction>_>::operator[]
                          (this_01,(long)local_1a4);
      Fraction::ToLaTex_abi_cxx11_(&local_1c8,this_02);
      std::operator<<((ostream *)local_190,(string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      if (local_1a4 + 1 != this->m_) {
        std::operator<<((ostream *)local_190," & ");
      }
    }
    if (local_1a0 + 1 != this->n_) {
      std::operator<<((ostream *)local_190," \\\\");
    }
    std::ostream::operator<<(local_190,std::endl<char,std::char_traits<char>>);
  }
  std::operator<<((ostream *)local_190,"\\end{bmatrix}");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string Matrix::ToLaTex() const {
  std::ostringstream out;
  out << "\\begin{bmatrix}" << std::endl;
  for (int i = 0; i < n_; ++i) {
    for (int j = 0; j < m_; ++j) {
      out << elements_[i][j].ToLaTex();
      if (j + 1 != m_) {
        out << " & ";
      }
    }
    if (i + 1 != n_) {
      out << " \\\\";
    }
    out << std::endl;
  }
  out << "\\end{bmatrix}";

  return out.str();
}